

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O3

LogStream * __thiscall muduo::LogStream::operator<<(LogStream *this,int v)

{
  char **ppcVar1;
  char *buf;
  size_t sVar2;
  
  ppcVar1 = &(this->buffer_).cur_;
  buf = (this->buffer_).cur_;
  if (0x1f < (int)ppcVar1 - (int)buf) {
    sVar2 = detail::convert<int>(buf,v);
    *ppcVar1 = *ppcVar1 + sVar2;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(int v)
{
  formatInteger(v);
  return *this;
}